

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

CURLcode Curl_resolver_is_resolved(connectdata *conn,Curl_dns_entry **entry)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  timediff_t tVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  curltime cVar10;
  curltime newer;
  curltime older;
  
  pCVar1 = conn->data;
  pvVar2 = (conn->async).os_specific;
  *entry = (Curl_dns_entry *)0x0;
  if (pvVar2 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar2 + 0x18));
  iVar5 = *(int *)((long)pvVar2 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar2 + 0x18));
  if (iVar5 != 0) {
    pvVar2 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar2 + 0x48),*(Curl_addrinfo **)((long)pvVar2 + 0x50));
    *(undefined8 *)((long)pvVar2 + 0x50) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *entry = (conn->async).dns;
      return CURLE_OK;
    }
    bVar9 = ((conn->bits).field_0x4 & 0x40) == 0;
    pcVar8 = "proxy";
    if (bVar9) {
      pcVar8 = "host";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar8,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return bVar9 + CURLE_COULDNT_RESOLVE_PROXY;
  }
  cVar10 = Curl_now();
  uVar3 = (pCVar1->progress).t_startsingle.tv_sec;
  uVar4 = (pCVar1->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar10._0_12_,0);
  newer.tv_usec = SUB124(cVar10._0_12_,8);
  older._12_4_ = 0;
  tVar6 = Curl_timediff(newer,older);
  lVar7 = 0;
  if (0 < tVar6) {
    lVar7 = tVar6;
  }
  if (*(int *)((long)pvVar2 + 8) == 0) {
    iVar5 = 1;
  }
  else {
    if (lVar7 < *(long *)((long)pvVar2 + 0x10)) goto LAB_00139dc9;
    iVar5 = *(int *)((long)pvVar2 + 8) * 2;
  }
  *(int *)((long)pvVar2 + 8) = iVar5;
LAB_00139dc9:
  if (0xfa < *(uint *)((long)pvVar2 + 8)) {
    *(undefined4 *)((long)pvVar2 + 8) = 0xfa;
  }
  *(ulong *)((long)pvVar2 + 0x10) = lVar7 + (ulong)*(uint *)((long)pvVar2 + 8);
  Curl_expire(conn->data,(ulong)*(uint *)((long)pvVar2 + 8),EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct Curl_easy *data = conn->data;
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  int done = 0;

  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(conn);

    if(!conn->async.dns) {
      CURLcode result = resolver_error(conn);
      destroy_async_data(&conn->async);
      return result;
    }
    destroy_async_data(&conn->async);
    *entry = conn->async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    /* should be fine even if this converts to 32 bit */
    time_t elapsed = (time_t)Curl_timediff(Curl_now(),
                                           data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(conn->data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}